

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O3

TRef lj_ir_call(jit_State *J,IRCallID id,...)

{
  uint uVar1;
  char in_AL;
  IRRef1 IVar2;
  undefined8 in_RCX;
  void **ppvVar4;
  uint uVar5;
  undefined8 in_RDX;
  ulong uVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  void **local_f0;
  void *local_d8 [2];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  TRef TVar3;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  uVar1 = lj_ir_callinfo[id].flags;
  local_f0 = &argp[0].overflow_arg_area;
  uVar7 = ((int)(uVar1 << 0x17) >> 0x1f) + (uVar1 & 0xff);
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (uVar7 == 0) {
    IVar2 = 0x7fff;
  }
  else {
    uVar5 = 0x18;
    IVar2 = (IRRef1)(TRef)local_c8;
    TVar3 = (TRef)local_c8;
    if (uVar7 != 1) {
      do {
        uVar6 = (ulong)uVar5;
        if (uVar6 < 0x29) {
          uVar5 = uVar5 + 8;
          ppvVar4 = (void **)((long)local_d8 + uVar6);
        }
        else {
          ppvVar4 = local_f0;
          local_f0 = local_f0 + 1;
        }
        uVar7 = uVar7 - 1;
        IVar2 = *(IRRef1 *)ppvVar4;
        (J->fold).ins.field_0.ot = 0x6400;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
        (J->fold).ins.field_0.op2 = IVar2;
        TVar3 = lj_opt_fold(J);
        IVar2 = (IRRef1)TVar3;
      } while (1 < uVar7);
    }
  }
  if ((uVar1 & 0xff000000) == 0x62000000) {
    J->needsnap = '\x01';
  }
  (J->fold).ins.field_0.ot = (IROpT)(uVar1 >> 0x10);
  (J->fold).ins.field_0.op1 = IVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)id;
  TVar3 = lj_opt_fold(J);
  return TVar3;
}

Assistant:

TRef lj_ir_call(jit_State *J, IRCallID id, ...)
{
  const CCallInfo *ci = &lj_ir_callinfo[id];
  uint32_t n = CCI_NARGS(ci);
  TRef tr = TREF_NIL;
  va_list argp;
  va_start(argp, id);
  if ((ci->flags & CCI_L)) n--;
  if (n > 0)
    tr = va_arg(argp, IRRef);
  while (n-- > 1)
    tr = emitir(IRT(IR_CARG, IRT_NIL), tr, va_arg(argp, IRRef));
  va_end(argp);
  if (CCI_OP(ci) == IR_CALLS)
    J->needsnap = 1;  /* Need snapshot after call with side effect. */
  return emitir(CCI_OPTYPE(ci), tr, id);
}